

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall smf::Options::appendOptions(Options *this,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference this_00;
  int local_28;
  int i;
  int oldsize;
  char **argv_local;
  int argc_local;
  Options *this_local;
  
  this->m_processedQ = false;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_extraArgv);
  iVar2 = (int)sVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_extraArgv,(long)(iVar2 + argc));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_extraArgv_strings,(long)(iVar2 + argc));
  for (local_28 = 0; local_28 < argc; local_28 = local_28 + 1) {
    pcVar1 = argv[local_28];
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_extraArgv_strings,(long)(local_28 + iVar2));
    std::__cxx11::string::operator=((string *)pvVar4,pcVar1);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_extraArgv_strings,(long)(local_28 + iVar2));
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->m_extraArgv,(long)(local_28 + iVar2));
    std::__cxx11::string::operator=((string *)this_00,(string *)pvVar4);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_extraArgv);
  this->m_oargc = (int)sVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_oargv,&this->m_extraArgv);
  return;
}

Assistant:

void Options::appendOptions(int argc, char** argv) {
	m_processedQ = 0;

	// data used to be stored directly here:
	//gargc = argc;
	//gargv = argv;
	// but now gets interfaced to: m_extraArgv and m_extraArgv_strings:

	int oldsize = (int)m_extraArgv.size();
	m_extraArgv.resize(oldsize + argc);
	m_extraArgv_strings.resize(oldsize + argc);

	int i;
	for (i=0; i<argc; i++) {
		m_extraArgv_strings[i+oldsize] = argv[i];
		m_extraArgv[i+oldsize] = m_extraArgv_strings[i+oldsize];
	}

	m_oargc = (int)m_extraArgv.size();
	m_oargv = m_extraArgv;
}